

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QTextLayout::FormatRange>::reallocateAndGrow
          (QArrayDataPointer<QTextLayout::FormatRange> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QTextLayout::FormatRange> *old)

{
  FormatRange *pFVar1;
  QArrayData *pQVar2;
  Data *pDVar3;
  FormatRange *pFVar4;
  qsizetype qVar5;
  long lVar6;
  QTextCharFormat *pQVar7;
  FormatRange *pFVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  QArrayDataPointer<QTextLayout::FormatRange> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QTextLayout::FormatRange> *)0x0 && where == GrowsAtEnd) &&
       (pQVar2 = &this->d->super_QArrayData, pQVar2 != (QArrayData *)0x0)) && (0 < n)) &&
     ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar9 = QArrayData::reallocateUnaligned
                       (pQVar2,this->ptr,0x18,
                        n + this->size +
                        ((long)((long)this->ptr -
                               ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
                        -0x5555555555555555,Grow);
    this->d = (Data *)auVar9._0_8_;
    this->ptr = (FormatRange *)auVar9._8_8_;
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (FormatRange *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_48,this,n,where);
    pFVar4 = local_48.ptr;
    if (this->size != 0) {
      lVar6 = this->size + (n >> 0x3f & n);
      if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QTextLayout::FormatRange> *)0x0))
         || (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        if ((lVar6 != 0) && (0 < lVar6)) {
          pFVar8 = this->ptr;
          pFVar1 = pFVar8 + lVar6;
          do {
            pQVar7 = &pFVar4[local_48.size].format;
            *(undefined8 *)((long)(pQVar7 + -1) + 8) = *(undefined8 *)pFVar8;
            QTextFormat::QTextFormat(&pQVar7->super_QTextFormat,&(pFVar8->format).super_QTextFormat)
            ;
            local_48.size = local_48.size + 1;
            pFVar8 = pFVar8 + 1;
          } while (pFVar8 < pFVar1);
        }
      }
      else if ((lVar6 != 0) && (0 < lVar6)) {
        pFVar8 = this->ptr;
        pFVar1 = pFVar8 + lVar6;
        do {
          pQVar7 = &pFVar4[local_48.size].format;
          *(undefined8 *)((long)(pQVar7 + -1) + 8) = *(undefined8 *)pFVar8;
          QTextFormat::QTextFormat(&pQVar7->super_QTextFormat,&(pFVar8->format).super_QTextFormat);
          local_48.size = local_48.size + 1;
          pFVar8 = pFVar8 + 1;
        } while (pFVar8 < pFVar1);
      }
    }
    pDVar3 = this->d;
    pFVar4 = this->ptr;
    this->d = local_48.d;
    this->ptr = local_48.ptr;
    qVar5 = this->size;
    this->size = local_48.size;
    local_48.d = pDVar3;
    local_48.ptr = pFVar4;
    local_48.size = qVar5;
    if (old != (QArrayDataPointer<QTextLayout::FormatRange> *)0x0) {
      local_48.d = old->d;
      local_48.ptr = old->ptr;
      old->d = pDVar3;
      old->ptr = pFVar4;
      local_48.size = old->size;
      old->size = qVar5;
    }
    ~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }